

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void free_flatten_example(flat_example *fec)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    features::delete_v((features *)fec);
    if (*(long *)((long)in_RDI + 0x28) != 0) {
      free(*(void **)((long)in_RDI + 0x30));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void free_flatten_example(flat_example* fec)
{
  // note: The label memory should be freed by by freeing the original example.
  if (fec)
  {
    fec->fs.delete_v();
    if (fec->tag_len > 0)
      free(fec->tag);
    free(fec);
  }
}